

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O2

void __thiscall
MeshSplitter::UpdateNode
          (MeshSplitter *this,aiNode *pcNode,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *source_mesh_map)

{
  uint uVar1;
  pointer ppVar2;
  pointer ppVar3;
  uint b;
  uint *puVar4;
  uint i;
  ulong uVar5;
  ulong uVar6;
  uint a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aiEntries;
  
  aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&aiEntries,(ulong)(pcNode->mNumMeshes + 1));
  for (uVar5 = 0; uVar5 < pcNode->mNumMeshes; uVar5 = uVar5 + 1) {
    a = 0;
    ppVar2 = (source_mesh_map->
             super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    ppVar3 = (source_mesh_map->
             super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (; a < (uint)((ulong)((long)ppVar2 - (long)ppVar3) >> 4); a = a + 1) {
      if ((source_mesh_map->
          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          )._M_impl.super__Vector_impl_data._M_start[a].second == pcNode->mMeshes[uVar5]) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&aiEntries,&a);
      }
    }
  }
  operator_delete(pcNode->mMeshes,4);
  uVar6 = (ulong)((long)aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2;
  pcNode->mNumMeshes = (uint)uVar6;
  puVar4 = (uint *)operator_new__((long)aiEntries.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)aiEntries.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start & 0x3fffffffc);
  pcNode->mMeshes = puVar4;
  for (uVar5 = 0; uVar5 < (uVar6 & 0xffffffff); uVar5 = uVar5 + 1) {
    pcNode->mMeshes[uVar5] =
         aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5];
    uVar6 = (ulong)pcNode->mNumMeshes;
  }
  uVar1 = pcNode->mNumChildren;
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    UpdateNode(this,pcNode->mChildren[uVar5],source_mesh_map);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void MeshSplitter::UpdateNode(aiNode* pcNode, const std::vector<std::pair<aiMesh*, unsigned int> >& source_mesh_map) {
	// TODO: should better use std::(multi)set for source_mesh_map.

	// for every index in out list build a new entry
	std::vector<unsigned int> aiEntries;
	aiEntries.reserve(pcNode->mNumMeshes + 1);
	for (unsigned int i = 0; i < pcNode->mNumMeshes;++i)	{
		for (unsigned int a = 0, end = static_cast<unsigned int>(source_mesh_map.size()); a < end;++a)	{
			if (source_mesh_map[a].second == pcNode->mMeshes[i])	{
				aiEntries.push_back(a);
			}
		}
	}

	// now build the new list
	delete pcNode->mMeshes;
	pcNode->mNumMeshes = static_cast<unsigned int>(aiEntries.size());
	pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];

	for (unsigned int b = 0; b < pcNode->mNumMeshes;++b) {
		pcNode->mMeshes[b] = aiEntries[b];
	}

	// recursively update children
	for (unsigned int i = 0, end = pcNode->mNumChildren; i < end;++i)	{
		UpdateNode ( pcNode->mChildren[i], source_mesh_map );
	}
	return;
}